

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.h
# Opt level: O3

void __thiscall Assignment::~Assignment(Assignment *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_BinaryOperator).super_Expression._vptr_Expression =
       (_func_int **)&PTR_evaluate_00130b70;
  p_Var1 = (this->super_BinaryOperator).operation.
           super___shared_ptr<Operation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->super_BinaryOperator).rightExpression.
           super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->super_BinaryOperator).leftExpression.
           super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

Assignment(ptr<Operation> operation, ptr<Expression> left, ptr<Expression> right) : BinaryOperator(operation, left, right) { }